

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

MppDevBufMapNode * mpp_buffer_attach_dev_lock(char *caller,MppBuffer buffer,MppDev dev)

{
  pthread_mutex_t *__mutex;
  MppDevBufMapNode *pMVar1;
  list_head *plVar2;
  MPP_RET MVar3;
  MppDevBufMapNode *param;
  
  mpp_dev_ioctl(dev,0xb,(void *)0x0);
  __mutex = (pthread_mutex_t *)((long)buffer + 0x28);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  pMVar1 = (MppDevBufMapNode *)((long)buffer + 0xd8);
  param = pMVar1;
  do {
    param = (MppDevBufMapNode *)(param->list_buf).next;
    if (param == pMVar1) {
      param = (MppDevBufMapNode *)mpp_mem_pool_get_f(caller,mpp_buf_map_node_pool);
      if (param == (MppDevBufMapNode *)0x0) {
        param = (MppDevBufMapNode *)0x0;
        _mpp_log_l(2,"mpp_buffer","mpp_buffer_attach_dev failed to allocate map node\n",(char *)0x0)
        ;
      }
      else {
        (param->list_buf).next = (list_head *)param;
        (param->list_buf).prev = (list_head *)param;
        (param->list_dev).next = &param->list_dev;
        (param->list_dev).prev = &param->list_dev;
        param->lock_buf = __mutex;
        param->buffer = buffer;
        param->dev = dev;
        param->pool = mpp_buf_map_node_pool;
        param->buf_fd = *(RK_S32 *)((long)buffer + 0xa0);
        MVar3 = mpp_dev_ioctl(dev,0xd,param);
        if (MVar3 == MPP_OK) {
          plVar2 = *(list_head **)((long)buffer + 0xe0);
          *(MppDevBufMapNode **)((long)buffer + 0xe0) = param;
          (param->list_buf).next = (list_head *)pMVar1;
          (param->list_buf).prev = plVar2;
          plVar2->next = (list_head *)param;
        }
        else {
          mpp_mem_pool_put_f(caller,mpp_buf_map_node_pool,param);
          param = (MppDevBufMapNode *)0x0;
        }
      }
      break;
    }
  } while (param->dev != dev);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  mpp_dev_ioctl(dev,0xc,(void *)0x0);
  return param;
}

Assistant:

static MppDevBufMapNode *mpp_buffer_attach_dev_lock(const char *caller, MppBuffer buffer, MppDev dev)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;
    MppDevBufMapNode *pos, *n;
    MppDevBufMapNode *node = NULL;
    MPP_RET ret = MPP_OK;

    mpp_dev_ioctl(dev, MPP_DEV_LOCK_MAP, NULL);
    pthread_mutex_lock(&impl->lock);

    list_for_each_entry_safe(pos, n, &impl->list_maps, MppDevBufMapNode, list_buf) {
        if (pos->dev == dev) {
            node = pos;
            goto DONE;
        }
    }

    node = (MppDevBufMapNode *)mpp_mem_pool_get_f(caller, mpp_buf_map_node_pool);
    if (!node) {
        mpp_err("mpp_buffer_attach_dev failed to allocate map node\n");
        ret = MPP_NOK;
        goto DONE;
    }

    INIT_LIST_HEAD(&node->list_buf);
    INIT_LIST_HEAD(&node->list_dev);
    node->lock_buf = &impl->lock;
    node->buffer = impl;
    node->dev = dev;
    node->pool = mpp_buf_map_node_pool;
    node->buf_fd = impl->info.fd;

    ret = mpp_dev_ioctl(dev, MPP_DEV_ATTACH_FD, node);
    if (ret) {
        mpp_mem_pool_put_f(caller, mpp_buf_map_node_pool, node);
        node = NULL;
        goto DONE;
    }
    list_add_tail(&node->list_buf, &impl->list_maps);

DONE:
    pthread_mutex_unlock(&impl->lock);
    mpp_dev_ioctl(dev, MPP_DEV_UNLOCK_MAP, NULL);

    return node;
}